

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::get_lex(Parser *this)

{
  lex_t lVar1;
  int iVar2;
  reference pLVar3;
  ostream *this_00;
  Parser *this_local;
  
  pLVar3 = __gnu_cxx::__normal_iterator<const_Lex_*,_std::vector<Lex,_std::allocator<Lex>_>_>::
           operator*(&this->index);
  iVar2 = pLVar3->value;
  (this->c_lex).type = pLVar3->type;
  (this->c_lex).value = iVar2;
  (this->c_lex).add_value = pLVar3->add_value;
  lVar1 = Lex::get_type(&this->c_lex);
  this->c_type = lVar1;
  iVar2 = Lex::get_value(&this->c_lex);
  this->c_val = iVar2;
  iVar2 = Lex::get_add_value(&this->c_lex);
  this->c_add_val = iVar2;
  __gnu_cxx::__normal_iterator<const_Lex_*,_std::vector<Lex,_std::allocator<Lex>_>_>::operator++
            (&this->index);
  if (DEBUG_MODE != 0) {
    this_00 = operator<<((ostream *)&std::cout,&this->c_lex);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Parser::get_lex() {
    c_lex = *index;
    c_type = c_lex.get_type();
    c_val = c_lex.get_value();
    c_add_val = c_lex.get_add_value();
    ++index;
    if (DEBUG_MODE)
        cout << c_lex << endl;
}